

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isCastCompatible(Type *this,Type *rhs)

{
  bool bVar1;
  Type *r;
  Type *l;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined1 local_1;
  
  getCanonicalType((Type *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  getCanonicalType((Type *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  bVar1 = isAssignmentCompatible(this,rhs);
  if (bVar1) {
    local_1 = true;
  }
  else {
    bVar1 = isEnum((Type *)0x820a65);
    if (bVar1) {
      bVar1 = isIntegral((Type *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      local_1 = true;
      if (!bVar1) {
        local_1 = isFloating((Type *)0x820a8c);
      }
    }
    else {
      bVar1 = isString((Type *)0x820aa6);
      if (bVar1) {
        local_1 = isIntegral((Type *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      }
      else {
        bVar1 = isString((Type *)0x820ac8);
        if (bVar1) {
          local_1 = isIntegral((Type *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0)
                              );
        }
        else {
          local_1 = false;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool Type::isCastCompatible(const Type& rhs) const {
    // See [6.22.4] for Cast Compatible
    const Type* l = &getCanonicalType();
    const Type* r = &rhs.getCanonicalType();
    if (l->isAssignmentCompatible(*r))
        return true;

    if (l->isEnum())
        return r->isIntegral() || r->isFloating();

    if (l->isString())
        return r->isIntegral();

    if (r->isString())
        return l->isIntegral();

    return false;
}